

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryOutStream.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2435f::TestStreamingMultipleTimesConcatenatesResult::RunImpl
          (TestStreamingMultipleTimesConcatenatesResult *this)

{
  TestResults *results;
  ostream *poVar1;
  TestResults **ppTVar2;
  char *actual;
  TestDetails **ppTVar3;
  TestDetails TStack_1c8;
  MemoryOutStream stream;
  
  UnitTest::MemoryOutStream::MemoryOutStream(&stream);
  poVar1 = std::operator<<((ostream *)&stream,"Bork");
  poVar1 = std::operator<<(poVar1,"Foo");
  std::operator<<(poVar1,"Bar");
  ppTVar2 = UnitTest::CurrentTest::Results();
  results = *ppTVar2;
  actual = UnitTest::MemoryOutStream::GetText(&stream);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&TStack_1c8,*ppTVar3,0x1d);
  UnitTest::CheckEqual(results,"BorkFooBar",actual,&TStack_1c8);
  UnitTest::MemoryOutStream::~MemoryOutStream(&stream);
  return;
}

Assistant:

TEST(StreamingMultipleTimesConcatenatesResult)
{
    MemoryOutStream stream;
    stream << "Bork" << "Foo" << "Bar";
    CHECK_EQUAL("BorkFooBar", stream.GetText());
}